

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O2

void __thiscall
iu_UnitStringTest_x_iutest_x_FormatSizeGByte_Test::Body
          (iu_UnitStringTest_x_iutest_x_FormatSizeGByte_Test *this)

{
  UInt64 in_RDX;
  AssertionResult iutest_ar;
  _Alloc_hider in_stack_fffffffffffffde8;
  bool local_1f8;
  iuCodeMessage local_1f0;
  string local_1c0;
  Fixed local_1a0;
  
  iutest::detail::FormatSizeByte_abi_cxx11_(&local_1c0,(detail *)0x40000000,in_RDX);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            ((AssertionResult *)&stack0xfffffffffffffde8,(internal *)"\"1GB\"",
             "::iutest::detail::FormatSizeByte(1024 * 1024 * 1024)","1GB",(char *)&local_1c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,(type **)in_stack_fffffffffffffde8._M_p);
  std::__cxx11::string::~string((string *)&local_1c0);
  if (local_1f8 == false) {
    memset(&local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x10e,in_stack_fffffffffffffde8._M_p);
    local_1f0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
  }
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffde8);
  return;
}

Assistant:

IUTEST(UnitStringTest, FormatSizeGByte)
{
    IUTEST_EXPECT_STREQ("1GB", ::iutest::detail::FormatSizeByte(1024 * 1024 * 1024));
}